

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

bool __thiscall
wasm::anon_unknown_0::ModuleAnalyzer::canChangeState
          (ModuleAnalyzer *this,Expression *curr,Function *func)

{
  mapped_type *pmVar1;
  byte local_141;
  undefined1 local_118 [8];
  Walker walker;
  Function *func_local;
  Expression *curr_local;
  ModuleAnalyzer *this_local;
  
  walker._240_8_ = func;
  func_local = (Function *)curr;
  curr_local = (Expression *)this;
  canChangeState::Walker::Walker((Walker *)local_118);
  walker.super_PostWalker<Walker,_wasm::Visitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::Visitor<Walker,_void>_>.currModule = this->module;
  walker.analyzer = (ModuleAnalyzer *)&this->map;
  walker.module = (Module *)this;
  Walker<Walker,_wasm::Visitor<Walker,_void>_>::walk
            ((Walker<Walker,_wasm::Visitor<Walker,_void>_> *)local_118,(Expression **)&func_local);
  if (((byte)walker.map & 1) != 0) {
    if ((this->canIndirectChangeState & 1U) == 0) {
      pmVar1 = std::
               map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
               ::operator[](&this->map,(key_type *)&walker.hasIndirectCall);
      if ((pmVar1->addedFromList & 1U) == 0) goto LAB_01aa0214;
    }
    walker.map._1_1_ = 1;
  }
LAB_01aa0214:
  local_141 = 0;
  if ((walker.map._1_1_ & 1) != 0) {
    local_141 = walker.map._2_1_ ^ 0xff;
  }
  canChangeState::Walker::~Walker((Walker *)local_118);
  return (bool)(local_141 & 1);
}

Assistant:

bool canChangeState(Expression* curr, Function* func) {
    // Look inside to see if we call any of the things we know can change the
    // state.
    // TODO: caching, this is O(N^2)
    struct Walker : PostWalker<Walker> {
      void visitCall(Call* curr) {
        // We only implement these at the very end, but we know that they
        // definitely change the state.
        if (curr->target == ASYNCIFY_START_UNWIND ||
            curr->target == ASYNCIFY_STOP_REWIND ||
            curr->target == ASYNCIFY_GET_CALL_INDEX ||
            curr->target == ASYNCIFY_CHECK_CALL_INDEX) {
          canChangeState = true;
          return;
        }
        if (curr->target == ASYNCIFY_STOP_UNWIND ||
            curr->target == ASYNCIFY_START_REWIND) {
          isBottomMostRuntime = true;
          return;
        }
        // The target may not exist if it is one of our temporary intrinsics.
        auto* target = module->getFunctionOrNull(curr->target);
        if (target && (*map)[target].canChangeState) {
          canChangeState = true;
        }
      }
      void visitCallIndirect(CallIndirect* curr) { hasIndirectCall = true; }
      Module* module;
      ModuleAnalyzer* analyzer;
      Map* map;
      bool hasIndirectCall = false;
      bool canChangeState = false;
      bool isBottomMostRuntime = false;
    };
    Walker walker;
    walker.module = &module;
    walker.analyzer = this;
    walker.map = &map;
    walker.walk(curr);
    // An indirect call is normally ignored if we are ignoring indirect calls.
    // However, see the docs at the top: if the function we are inside was
    // specifically added by the user (in the only-list or the add-list) then we
    // instrument indirect calls from it (this allows specifically allowing some
    // indirect calls but not others).
    if (walker.hasIndirectCall &&
        (canIndirectChangeState || map[func].addedFromList)) {
      walker.canChangeState = true;
    }
    // The bottom-most runtime can never change the state.
    return walker.canChangeState && !walker.isBottomMostRuntime;
  }